

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

clip_image_size
llava_uhd::select_best_resolution
          (vector<int,_std::allocator<int>_> *pinpoints,clip_image_size *original_size)

{
  size_type sVar1;
  clip_image_size cVar2;
  vector<clip_image_size,_std::allocator<clip_image_size>_> *in_RDI;
  size_t i;
  vector<clip_image_size,_std::allocator<clip_image_size>_> possible_resolutions;
  value_type *in_stack_ffffffffffffff98;
  vector<clip_image_size,_std::allocator<clip_image_size>_> *in_stack_ffffffffffffffa0;
  vector<clip_image_size,_std::allocator<clip_image_size>_> *in_stack_ffffffffffffffb0;
  undefined8 local_38;
  clip_image_size *in_stack_fffffffffffffff8;
  
  std::vector<clip_image_size,_std::allocator<clip_image_size>_>::vector
            ((vector<clip_image_size,_std::allocator<clip_image_size>_> *)0x1994e8);
  local_38 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)in_RDI);
    if (sVar1 <= local_38) break;
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_RDI,local_38);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)in_RDI,local_38 + 1);
    std::vector<clip_image_size,_std::allocator<clip_image_size>_>::push_back
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_38 = local_38 + 2;
  }
  cVar2 = select_best_resolution(in_stack_fffffffffffffff8,in_RDI);
  std::vector<clip_image_size,_std::allocator<clip_image_size>_>::~vector(in_stack_ffffffffffffffb0)
  ;
  return cVar2;
}

Assistant:

static clip_image_size select_best_resolution(const std::vector<int32_t> & pinpoints, const clip_image_size & original_size) {
        std::vector<clip_image_size> possible_resolutions;
        for (size_t i = 0; i < pinpoints.size(); i += 2) {
            possible_resolutions.push_back(clip_image_size{pinpoints[i], pinpoints[i+1]});
        }
        return select_best_resolution(original_size, possible_resolutions);
    }